

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall GdlRenderer::MaxJustificationLevel(GdlRenderer *this,int *pnJLevel)

{
  size_type_conflict sVar1;
  GdlRuleTable *pGVar2;
  int *in_RSI;
  int *in_RDI;
  size_t iprultbl;
  size_t ipglfc;
  int *in_stack_00000058;
  GdlGlyphClassDefn *in_stack_00000060;
  GdlRuleTable *pGVar3;
  GdlRuleTable *this_00;
  ulong local_18;
  
  for (local_18 = 0;
      sVar1 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::size
                        ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                         (in_RDI + 0x10)), local_18 < sVar1; local_18 = local_18 + 1) {
    std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::operator[]
              ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)(in_RDI + 0x10),
               local_18);
    GdlGlyphClassDefn::MaxJustificationLevel(in_stack_00000060,in_stack_00000058);
    if (2 < *in_RSI) {
      return;
    }
  }
  pGVar3 = (GdlRuleTable *)0x0;
  while( true ) {
    this_00 = pGVar3;
    pGVar2 = (GdlRuleTable *)
             std::vector<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_>::size
                       ((vector<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_> *)(in_RDI + 10));
    if (pGVar2 <= pGVar3) {
      return;
    }
    std::vector<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_>::operator[]
              ((vector<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_> *)(in_RDI + 10),
               (size_type_conflict)this_00);
    GdlRuleTable::MaxJustificationLevel(this_00,in_RDI);
    if (2 < *in_RSI) break;
    pGVar3 = (GdlRuleTable *)((long)&(this_00->super_GdlObject).m_lnf.m_nLinePre + 1);
  }
  return;
}

Assistant:

void GdlRenderer::MaxJustificationLevel(int * pnJLevel)
{
	//	Glyph atrributes:
	for (size_t ipglfc = 0; ipglfc < m_vpglfc.size(); ipglfc++)
	{
		m_vpglfc[ipglfc]->MaxJustificationLevel(pnJLevel);
		if (*pnJLevel >= kMaxJustLevel)
			return;
	}
	//	Rules:
	for (size_t iprultbl = 0; iprultbl < m_vprultbl.size(); iprultbl++)
	{
		m_vprultbl[iprultbl]->MaxJustificationLevel(pnJLevel);
		if (*pnJLevel >= kMaxJustLevel)
			return;
	}
}